

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

shared_ptr<QPDFLogger> __thiscall QPDF::getLogger(QPDF *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<QPDFLogger> sVar1;
  
  std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *)*in_RSI);
  sVar1.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFLogger>)sVar1.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFLogger>
QPDF::getLogger()
{
    return m->log;
}